

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O2

void __thiscall
ctemplate::TemplateToken::UpdateModifier
          (TemplateToken *this,
          vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
          *auto_modvals)

{
  vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_> *this_00;
  XssClass XVar1;
  pointer pMVar2;
  ModifierAndValue *pMVar3;
  bool bVar4;
  const_iterator it;
  pointer pMVar5;
  pointer ppMVar6;
  pointer ppMVar7;
  pointer pMVar8;
  ostream *poVar9;
  ulong uVar10;
  ModifierInfo *in_RDX;
  ModifierInfo *extraout_RDX;
  vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_> *modvals;
  ulong uVar11;
  pointer ppMVar12;
  __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
  __tmp;
  string before;
  allocator local_e1;
  TemplateToken *local_e0;
  pointer local_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = &this->modvals;
  pMVar5 = (this->modvals).
           super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar2 = (this->modvals).
           super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_e0 = this;
  if (pMVar5 == pMVar2) {
    for (ppMVar12 = (auto_modvals->
                    super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        ppMVar12 !=
        (auto_modvals->
        super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
        )._M_impl.super__Vector_impl_data._M_finish; ppMVar12 = ppMVar12 + 1) {
      std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>::
      push_back(this_00,*ppMVar12);
    }
    return;
  }
  while (pMVar5 != pMVar2) {
    in_RDX = pMVar5->modifier_info;
    pMVar5 = pMVar5 + 1;
    if (in_RDX->xss_class == XSS_SAFE) {
      return;
    }
  }
  ppMVar6 = (auto_modvals->
            super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppMVar12 = (auto_modvals->
             super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  uVar11 = 0;
  ppMVar7 = ppMVar6;
  if (ppMVar6 != ppMVar12) {
    while (ppMVar7 = ppMVar6, ppMVar12 != ppMVar6) {
      pMVar5 = (local_e0->modvals).
               super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ppMVar7 = ppMVar12;
      local_d8 = ppMVar12;
      while( true ) {
        if ((ppMVar7 == ppMVar6) ||
           (pMVar5 == (this_00->
                      super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                      )._M_impl.super__Vector_impl_data._M_start)) goto LAB_00124507;
        ppMVar12 = ppMVar7 + -1;
        pMVar2 = pMVar5 + -1;
        pMVar5 = pMVar5 + -1;
        bVar4 = IsSafeXSSAlternative(ppMVar7[-1]->modifier_info,pMVar2->modifier_info);
        in_RDX = extraout_RDX;
        if ((!bVar4) &&
           ((XVar1 = pMVar5->modifier_info->xss_class, XVar1 == XSS_UNIQUE ||
            (pMVar3 = *ppMVar12, ppMVar12 = ppMVar7, XVar1 != pMVar3->modifier_info->xss_class))))
        break;
        ppMVar6 = (auto_modvals->
                  super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        ppMVar7 = ppMVar12;
      }
      ppMVar6 = (auto_modvals->
                super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
LAB_00124507:
      if (ppMVar7 == ppMVar6) {
        uVar11 = (long)local_d8 - (long)ppMVar7 >> 3;
        break;
      }
      ppMVar12 = local_d8 + -1;
    }
  }
  uVar10 = (long)(auto_modvals->
                 super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar7 >> 3;
  if (uVar11 != uVar10) {
    if (uVar10 <= uVar11) {
      __assert_fail("longest_match >= 0 && longest_match < auto_modvals.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                    ,0x31d,
                    "void ctemplate::TemplateToken::UpdateModifier(const vector<const ModifierAndValue *> &)"
                   );
    }
    pMVar5 = (local_e0->modvals).
             super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pMVar2 = (local_e0->modvals).
             super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pMVar8 = pMVar2;
      if (pMVar8 == pMVar5) break;
      pMVar2 = pMVar8 + 1;
    } while (pMVar8->modifier_info->xss_class != XSS_WEB_STANDARD);
    (anonymous_namespace)::PrettyPrintTokenModifiers_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)this_00,
               (vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_> *)
               in_RDX);
    for (ppMVar12 = (auto_modvals->
                    super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar11;
        ppMVar12 !=
        (auto_modvals->
        super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
        )._M_impl.super__Vector_impl_data._M_finish; ppMVar12 = ppMVar12 + 1) {
      std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>::
      push_back(this_00,*ppMVar12);
    }
    if (pMVar8 != pMVar5) {
      poVar9 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
      poVar9 = std::operator<<(poVar9,"Token: ");
      local_d0[0] = local_c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d0,local_e0->text,local_e0->text + local_e0->textlen);
      poVar9 = std::operator<<(poVar9,(string *)local_d0);
      poVar9 = std::operator<<(poVar9," has missing in-template modifiers. You gave ");
      poVar9 = std::operator<<(poVar9,(string *)&local_50);
      poVar9 = std::operator<<(poVar9," and we computed ");
      std::__cxx11::string::string((string *)&local_90,"",&local_e1);
      PrettyPrintModifiers(&local_70,auto_modvals,&local_90);
      poVar9 = std::operator<<(poVar9,(string *)&local_70);
      poVar9 = std::operator<<(poVar9,". We changed to ");
      (anonymous_namespace)::PrettyPrintTokenModifiers_abi_cxx11_
                (&local_b0,(_anonymous_namespace_ *)this_00,modvals);
      poVar9 = std::operator<<(poVar9,(string *)&local_b0);
      std::endl<char,std::char_traits<char>>(poVar9);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)local_d0);
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void UpdateModifier(const vector<const ModifierAndValue*>& auto_modvals) {
    // Common case: no modifiers given in template. Assign our own. No warning.
    if (modvals.empty()) {
      for (vector<const ModifierAndValue*>::const_iterator it
               = auto_modvals.begin(); it != auto_modvals.end(); ++it) {
        modvals.push_back(**it);
      }
      return;
    }

    // Look for any XSS-Safe modifiers (added via AddXssSafeModifier or :none).
    // If one is found anywhere in the vector, consider the variable safe.
    for (vector<ModifierAndValue>::const_iterator it = modvals.begin();
         it != modvals.end(); ++it) {
      if (it->modifier_info->xss_class == XSS_SAFE)
        return;
    }

    size_t longest_match = FindLongestMatch(modvals, auto_modvals);
    if (longest_match == auto_modvals.size()) {
      return;             // We have a complete match, nothing to do.
    } else {              // Copy missing ones and issue warning.
      assert(longest_match >= 0 && longest_match < auto_modvals.size());
      // We only log if one or more of the in-template modifiers was
      // escaping-related which we infer from the XssClass. Currently,
      // all escaping modifiers are in XSS_WEB_STANDARD except for 'none'
      // but that one is handled above.
      bool do_log = false;
      for (vector<ModifierAndValue>::const_iterator it = modvals.begin();
           it != modvals.end(); ++it) {
        if (it->modifier_info->xss_class == XSS_WEB_STANDARD) {
          do_log = true;
          break;
        }
      }
      string before = PrettyPrintTokenModifiers(modvals);  // for logging
      for (vector<const ModifierAndValue*>::const_iterator it
               = auto_modvals.begin() + longest_match;
           it != auto_modvals.end(); ++it) {
        modvals.push_back(**it);
      }
      if (do_log)
        LOG(ERROR)
            << "Token: " << string(text, textlen)
            << " has missing in-template modifiers. You gave " << before
            << " and we computed " << PrettyPrintModifiers(auto_modvals, "")
            << ". We changed to " << PrettyPrintTokenModifiers(modvals) << endl;
    }
  }